

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall rw::World::addLight(World *this,Light *light)

{
  int32 iVar1;
  Frame *pFVar2;
  Light *light_local;
  World *this_local;
  
  light->world = this;
  iVar1 = Light::getType(light);
  if (iVar1 < 0x80) {
    LinkList::append(&this->globalLights,&light->inWorld);
  }
  else {
    LinkList::append(&this->localLights,&light->inWorld);
    pFVar2 = Light::getFrame(light);
    if (pFVar2 != (Frame *)0x0) {
      pFVar2 = Light::getFrame(light);
      Frame::updateObjects(pFVar2);
    }
  }
  return;
}

Assistant:

void
World::addLight(Light *light)
{
	assert(light->world == nil);
	light->world = this;
	if(light->getType() < Light::POINT){
		this->globalLights.append(&light->inWorld);
	}else{
		this->localLights.append(&light->inWorld);
		if(light->getFrame())
			light->getFrame()->updateObjects();
	}
}